

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

boolean write_full(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  void *local_38;
  char *buf2;
  ssize_t left;
  ssize_t ret;
  size_t count_local;
  void *buf_local;
  int fd_local;
  
  local_38 = buf;
  buf2 = (char *)count;
  while( true ) {
    if ((long)buf2 < 1) {
      return '\x01';
    }
    sVar1 = write(fd,local_38,(size_t)buf2);
    if (sVar1 == -1) break;
    local_38 = (void *)(sVar1 + (long)local_38);
    buf2 = buf2 + -sVar1;
  }
  return '\0';
}

Assistant:

boolean write_full(int fd, const void *buf, size_t count)
{
	ssize_t ret, left;
	const char *buf2 = buf;

	left = count;
	while (left > 0) {
	    ret = write(fd, buf2, left);
	    if (ret == -1)
		return FALSE;
	    buf2 += ret;
	    left -= ret;
	}

	return TRUE;
}